

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallExportGenerator::GetTempDir_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  if ((this->TempDir)._M_string_length == 0) {
    TempDirCalculate_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->TempDir);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::GetTempDir() const
{
  if (this->TempDir.empty()) {
    return this->TempDirCalculate();
  }
  return this->TempDir;
}